

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util.cpp
# Opt level: O1

int util::text_max_word_width(string *string)

{
  int iVar1;
  int iVar2;
  size_type sVar3;
  ulong uVar4;
  
  if (string->_M_string_length == 0) {
    iVar2 = 0;
    iVar1 = 0;
  }
  else {
    sVar3 = 0;
    iVar1 = 0;
    iVar2 = 0;
    do {
      uVar4 = (ulong)(byte)(string->_M_dataplus)._M_p[sVar3];
      if (uVar4 == 0x20) {
        if (iVar2 <= iVar1) {
          iVar2 = iVar1;
        }
        iVar1 = 0;
      }
      else {
        iVar1 = iVar1 + *(int *)(sizes + uVar4 * 4);
      }
      sVar3 = sVar3 + 1;
    } while (string->_M_string_length != sVar3);
  }
  if (iVar1 < iVar2) {
    iVar1 = iVar2;
  }
  return iVar1;
}

Assistant:

int text_max_word_width(const std::string& string)
{
	int max_length = 0;
	int length = 0;

	for (std::size_t i = 0; i < string.length(); ++i)
	{
		if (string[i] == ' ')
		{
			max_length = std::max(max_length, length);
			length = 0;
		}
		else
		{
			length += sizes[string[i] & 0xFF];
		}
	}

	return std::max(max_length, length);
}